

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void do_load_sel_object_search_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  Am_Wrapper *in_value;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Value local_d8;
  Am_Value local_c8;
  Am_Object local_b8;
  Am_Value local_b0;
  byte local_99;
  undefined1 local_98 [7];
  bool set_on;
  Am_Value v;
  Am_Object item;
  Am_Am_Slot_Key key;
  Am_Assoc as;
  Am_Value_List slots_to_save;
  Am_Object selected;
  Am_Value_List sel_list;
  Am_Value_List slots_to_item;
  Am_Object sel_widget;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object search_widget;
  Am_Object *cmd_local;
  
  search_widget.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar3 = Am_Object::Get(&local_18,0x197,0);
  Am_Object::Am_Object((Am_Object *)&slots_to_item.item,pAVar3);
  pAVar3 = Am_Object::Get(&local_18,Am_SLOTS_TO_ITEMS,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&sel_list.item,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&slots_to_item.item,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&selected,pAVar3);
  pAVar3 = Am_Value_List::Get_First((Am_Value_List *)&selected);
  Am_Object::Am_Object((Am_Object *)&slots_to_save.item,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&slots_to_save.item,0xb8,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&as,pAVar3);
  Am_Assoc::Am_Assoc((Am_Assoc *)&stack0xffffffffffffff88);
  Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&item.data + 6),0);
  Am_Object::Am_Object((Am_Object *)&v.value);
  Am_Value::Am_Value((Am_Value *)local_98);
  Am_Value_List::Start((Am_Value_List *)&sel_list.item);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)&sel_list.item), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = Am_Value_List::Get((Am_Value_List *)&sel_list.item);
    Am_Assoc::operator=((Am_Assoc *)&stack0xffffffffffffff88,pAVar3);
    Am_Assoc::Value_1((Am_Assoc *)&local_b0);
    Am_Am_Slot_Key::operator=((Am_Am_Slot_Key *)((long)&item.data + 6),&local_b0);
    Am_Value::~Am_Value(&local_b0);
    local_99 = 1;
    AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                      ((Am_Am_Slot_Key *)((long)&item.data + 6));
    if (AVar2 == 0xb) {
      Am_Object::Get_Prototype(&local_b8);
      in_value = Am_Object::operator_cast_to_Am_Wrapper_(&local_b8);
      Am_Value::operator=((Am_Value *)local_98,in_value);
      Am_Object::~Am_Object(&local_b8);
    }
    else {
      Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_c8);
      bVar1 = Am_Value_List::Start_Member((Am_Value_List *)&as,&local_c8);
      Am_Value::~Am_Value(&local_c8);
      if (bVar1) {
        AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                          ((Am_Am_Slot_Key *)((long)&item.data + 6));
        pAVar3 = Am_Object::Peek((Am_Object *)&slots_to_save.item,AVar2,0);
        Am_Value::operator=((Am_Value *)local_98,pAVar3);
        bVar1 = Am_Value::Exists((Am_Value *)local_98);
        if (!bVar1) {
          Am_Value::operator=((Am_Value *)local_98,0);
        }
      }
      else {
        local_99 = 0;
        AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                          ((Am_Am_Slot_Key *)((long)&item.data + 6));
        pAVar3 = Am_Object::Peek((Am_Object *)&slots_to_save.item,AVar2,0);
        Am_Value::operator=((Am_Value *)local_98,pAVar3);
      }
    }
    Am_Assoc::Value_2((Am_Assoc *)&local_d8);
    Am_Object::operator=((Am_Object *)&v.value,&local_d8);
    Am_Value::~Am_Value(&local_d8);
    bVar1 = Am_Value::Exists((Am_Value *)local_98);
    if (bVar1) {
      Am_Object::Get_Object(&local_e0,(short)&v + 8,(ulong)Am_USE_ITEM);
      Am_Object::Set(&local_e0,0x169,(bool)(local_99 & 1),0);
      Am_Object::~Am_Object(&local_e0);
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                        ((Am_Am_Slot_Key *)((long)&item.data + 6));
      if (AVar2 == 0xb) {
        Am_Object::Am_Object(&local_e8,(Am_Value *)local_98);
        set_type_of_search((Am_Object *)&v.value,&local_e8);
        Am_Object::~Am_Object(&local_e8);
      }
      else {
        Am_Object::Get_Object(&local_f0,(short)&v + 8,(ulong)Am_ITEM_VALUE);
        Am_Object::Set(&local_f0,0x169,(Am_Value *)local_98,0);
        Am_Object::~Am_Object(&local_f0);
        Am_Object::Get_Object(&local_f8,(short)&v + 8,(ulong)Am_ITEM_VALUE);
        Am_Object::Set(&local_f8,0xfa,(Am_Value *)local_98,0);
        Am_Object::~Am_Object(&local_f8);
      }
    }
    else {
      Am_Object::Get_Object(&local_100,(short)&v + 8,(ulong)Am_USE_ITEM);
      Am_Object::Set(&local_100,0x169,false,0);
      Am_Object::~Am_Object(&local_100);
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                        ((Am_Am_Slot_Key *)((long)&item.data + 6));
      if (AVar2 != 0xb) {
        Am_Object::Get_Object(&local_108,(short)&v + 8,(ulong)Am_ITEM_VALUE);
        Am_Object::Set(&local_108,0x169,"",0);
        Am_Object::~Am_Object(&local_108);
      }
    }
    Am_Value_List::Next((Am_Value_List *)&sel_list.item);
  }
  Am_Value::~Am_Value((Am_Value *)local_98);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  Am_Assoc::~Am_Assoc((Am_Assoc *)&stack0xffffffffffffff88);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&as);
  Am_Object::~Am_Object((Am_Object *)&slots_to_save.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&selected);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&sel_list.item);
  Am_Object::~Am_Object((Am_Object *)&slots_to_item.item);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_load_sel_object_search,
                 (Am_Object cmd))
{
  Am_Object search_widget = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List slots_to_item = search_widget.Get(Am_SLOTS_TO_ITEMS);
  Am_Value_List sel_list = sel_widget.Get(Am_VALUE);
  Am_Object selected = sel_list.Get_First();
  Am_Value_List slots_to_save = selected.Get(Am_SLOTS_TO_SAVE);
  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Object item;
  Am_Value v;
  bool set_on;
  for (slots_to_item.Start(); !slots_to_item.Last(); slots_to_item.Next()) {
    as = slots_to_item.Get();
    key = as.Value_1();
    set_on = true;
    if ((Am_Slot_Key)key == Am_PROTOTYPE)
      v = selected.Get_Prototype();
    else if (slots_to_save.Start_Member(key)) {
      v = selected.Peek(key);
      if (!v.Exists())
        v = 0; //supposed to be in this object, but invalid
    } else {
      set_on = false;
      v = selected.Peek(key);
    }
    item = as.Value_2();
    if (v.Exists()) {
      item.Get_Object(Am_USE_ITEM).Set(Am_VALUE, set_on);
      if ((Am_Slot_Key)key == Am_PROTOTYPE)
        set_type_of_search(item, v);
      else {
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, v);
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUES, v);
      }
    } else {
      item.Get_Object(Am_USE_ITEM).Set(Am_VALUE, false);
      if ((Am_Slot_Key)key != Am_PROTOTYPE)
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, "");
    }
  }
}